

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.h
# Opt level: O2

void __thiscall
absl::synchronization_internal::ThreadPool::ThreadPool(ThreadPool *this,int num_threads)

{
  uint uVar1;
  bool bVar2;
  ThreadPool *local_50;
  thread local_48;
  code *local_40;
  undefined8 local_38;
  
  (this->mu_).mu_.super___atomic_base<long>._M_i = 0;
  std::
  queue<std::function<void()>,std::deque<std::function<void()>,std::allocator<std::function<void()>>>>
  ::queue<std::deque<std::function<void()>,std::allocator<std::function<void()>>>,void>
            (&this->queue_);
  (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar1 = ~(num_threads >> 0x1f) & num_threads;
  (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  while (bVar2 = uVar1 != 0, uVar1 = uVar1 - 1, bVar2) {
    local_40 = WorkLoop;
    local_38 = 0;
    local_50 = this;
    std::thread::
    thread<void(absl::synchronization_internal::ThreadPool::*)(),absl::synchronization_internal::ThreadPool*,void>
              (&local_48,(type *)&local_40,&local_50);
    std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
              (&this->threads_,&local_48);
    std::thread::~thread(&local_48);
  }
  return;
}

Assistant:

explicit ThreadPool(int num_threads) {
    for (int i = 0; i < num_threads; ++i) {
      threads_.push_back(std::thread(&ThreadPool::WorkLoop, this));
    }
  }